

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

void QArrayData::deallocate(QArrayData *data,qsizetype objectSize,qsizetype alignment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t allocSize;
  ulong uVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = objectSize;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = data->alloc;
  uVar3 = SUB168(auVar1 * auVar2,0);
  allocSize = 0xffffffffffffffff;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    uVar5 = 0x10;
    if (0x10 < alignment) {
      uVar5 = alignment;
    }
    uVar6 = uVar5 + 2;
    if (2 < objectSize) {
      uVar6 = uVar5;
    }
    sVar4 = uVar3 + uVar6;
    if ((!CARRY8(uVar3,uVar6)) && (-1 < (long)sVar4)) {
      allocSize = sVar4;
    }
  }
  if (0 < (long)allocSize) {
    QtPrivate::sizedFree(data,allocSize);
    return;
  }
  free(data);
  return;
}

Assistant:

void QArrayData::deallocate(QArrayData *data, qsizetype objectSize,
        qsizetype alignment) noexcept
{
    // Alignment is a power of two
    Q_ASSERT(alignment >= qsizetype(alignof(QArrayData))
            && !(alignment & (alignment - 1)));

    const qsizetype capacity = data->alloc;
    const qsizetype headerSize = calculateHeaderSize(alignment);
    Q_ASSERT(headerSize > 0);
    const auto blockSize = calculateBlockSize(capacity, objectSize,
                                              headerSize, QArrayData::KeepSize);
    const qsizetype allocSize = blockSize.size;

    if (Q_LIKELY(allocSize > 0))
        QtPrivate::sizedFree(data, size_t(allocSize));
    else // something went wrong, fallback to slow free()
        free(data);
}